

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.c
# Opt level: O0

void NodeSingletonEvent(anynode *Any,dataid Cmd,nodemodule *Module)

{
  node **local_38;
  node **i;
  array List;
  nodemodule *Module_local;
  dataid Cmd_local;
  anynode *Any_local;
  
  List._Used = (size_t)Module;
  NodeEnumSingletonsEx(Any,(array *)&i,Module);
  local_38 = i;
  while( true ) {
    if (local_38 == (node **)((long)i + ((ulong)List._Begin & 0xfffffffffffffff8))) {
      ArrayClear((array *)&i);
      return;
    }
    if (*local_38 == (node *)0x0) break;
    (**(code **)((long)(*local_38)->VMT + 0x20))(*local_38,Cmd,0);
    local_38 = local_38 + 1;
  }
  __assert_fail("(const void*)(*i)!=NULL",
                "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/corec/corec/node/node.c"
                ,0xb13,"void NodeSingletonEvent(anynode *, dataid, nodemodule *)");
}

Assistant:

void NodeSingletonEvent(anynode* Any, dataid Cmd, nodemodule* Module)
{
    array List;
    node** i;

    NodeEnumSingletonsEx(Any,&List,Module);

    for (i=ARRAYBEGIN(List,node*);i!=ARRAYEND(List,node*);++i)
        Node_Trigger(*i,Cmd);

    ArrayClear(&List);
}